

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.h
# Opt level: O3

void __thiscall
spvtools::opt::LoopPeeling::LoopPeeling
          (LoopPeeling *this,Loop *loop,Instruction *loop_iteration_count,
          Instruction *canonical_induction_variable)

{
  IRContext *pIVar1;
  TypeManager *this_00;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  LoopDescriptor *pLVar6;
  Instruction *pIVar7;
  Type *pTVar8;
  undefined4 extraout_var;
  
  pIVar1 = loop->context_;
  this->context_ = pIVar1;
  (this->loop_utils_).context_ = pIVar1;
  pLVar6 = IRContext::GetLoopDescriptor(pIVar1,loop->loop_header_->function_);
  (this->loop_utils_).loop_desc_ = pLVar6;
  (this->loop_utils_).loop_ = loop;
  (this->loop_utils_).function_ = loop->loop_header_->function_;
  this->loop_ = loop;
  bVar2 = Loop::IsInsideLoop(loop,loop_iteration_count);
  pIVar7 = loop_iteration_count;
  if (bVar2) {
    pIVar7 = (Instruction *)0x0;
  }
  this->loop_iteration_count_ = pIVar7;
  this->int_type_ = (Integer *)0x0;
  this->original_loop_canonical_induction_variable_ = canonical_induction_variable;
  this->canonical_induction_variable_ = (Instruction *)0x0;
  (this->exit_value_)._M_h._M_buckets = &(this->exit_value_)._M_h._M_single_bucket;
  (this->exit_value_)._M_h._M_bucket_count = 1;
  (this->exit_value_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exit_value_)._M_h._M_element_count = 0;
  (this->exit_value_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exit_value_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exit_value_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (pIVar7 != (Instruction *)0x0) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
      IRContext::BuildTypeManager(pIVar1);
      loop_iteration_count = this->loop_iteration_count_;
    }
    this_00 = (pIVar1->type_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
    uVar3 = 0;
    if (loop_iteration_count->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(loop_iteration_count,0);
    }
    pTVar8 = analysis::TypeManager::GetType(this_00,uVar3);
    iVar4 = (*pTVar8->_vptr_Type[9])(pTVar8);
    this->int_type_ = (Integer *)CONCAT44(extraout_var,iVar4);
    pIVar7 = this->canonical_induction_variable_;
    if (pIVar7 != (Instruction *)0x0) {
      uVar5 = 0;
      uVar3 = 0;
      if (pIVar7->has_type_id_ == true) {
        uVar3 = Instruction::GetSingleWordOperand(pIVar7,0);
      }
      if (this->loop_iteration_count_->has_type_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(this->loop_iteration_count_,0);
      }
      if (uVar3 != uVar5) {
        __assert_fail("canonical_induction_variable_->type_id() == loop_iteration_count_->type_id() && \"loop_iteration_count and canonical_induction_variable do not \" \"have the same type\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.h"
                      ,99,
                      "spvtools::opt::LoopPeeling::LoopPeeling(Loop *, Instruction *, Instruction *)"
                     );
      }
    }
  }
  GetIteratingExitValues(this);
  return;
}

Assistant:

LoopPeeling(Loop* loop, Instruction* loop_iteration_count,
              Instruction* canonical_induction_variable = nullptr)
      : context_(loop->GetContext()),
        loop_utils_(loop->GetContext(), loop),
        loop_(loop),
        loop_iteration_count_(!loop->IsInsideLoop(loop_iteration_count)
                                  ? loop_iteration_count
                                  : nullptr),
        int_type_(nullptr),
        original_loop_canonical_induction_variable_(
            canonical_induction_variable),
        canonical_induction_variable_(nullptr) {
    if (loop_iteration_count_) {
      int_type_ = context_->get_type_mgr()
                      ->GetType(loop_iteration_count_->type_id())
                      ->AsInteger();
      if (canonical_induction_variable_) {
        assert(canonical_induction_variable_->type_id() ==
                   loop_iteration_count_->type_id() &&
               "loop_iteration_count and canonical_induction_variable do not "
               "have the same type");
      }
    }
    GetIteratingExitValues();
  }